

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

Section * scommon_section(GlobalVars *gv,ObjectUnit *ou)

{
  Section *n;
  
  n = ou->scommon;
  if (n == (Section *)0x0) {
    n = create_section(ou,gv->scommon_sec_name,(uint8_t *)0x0,0);
    n->type = '\x03';
    n->flags = '\x03';
    n->protection = '\x03';
    n->alignment = ou->min_alignment;
    n->id = 0xffffffff;
    addtail(&ou->sections,&n->n);
    if (ou->common != (Section *)0x0) {
      n->alignment = ou->common->alignment;
    }
    ou->scommon = n;
  }
  return n;
}

Assistant:

struct Section *scommon_section(struct GlobalVars *gv,struct ObjectUnit *ou)
/* returns the dummy section for small-data COMMON symbols, or creates it */
{
  struct Section *s;

  if (!(s = ou->scommon)) {
    s = add_section(ou,gv->scommon_sec_name,NULL,0,ST_UDATA,
                    SF_ALLOC|SF_UNINITIALIZED,SP_READ|SP_WRITE,0,TRUE);
    if (ou->common)
      s->alignment = ou->common->alignment;  /* inherit .common alignment */
    ou->scommon = s;
  }
  return s;
}